

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFArrayBox.cpp
# Opt level: O1

FArrayBox * __thiscall amrex::EBFArrayBox::getVolFracData(EBFArrayBox *this)

{
  int iVar1;
  FabArrayBase *this_00;
  FArrayBox *pFVar2;
  
  if ((this->m_factory == (EBFArrayBoxFactory *)0x0) || (this->m_box_index < 0)) {
    pFVar2 = (FArrayBox *)0x0;
  }
  else {
    this_00 = (FabArrayBase *)
              EBDataCollection::getVolFrac
                        ((this->m_factory->m_ebdc).
                         super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    iVar1 = FabArrayBase::localindex(this_00,this->m_box_index);
    pFVar2 = *(FArrayBox **)
              (*(long *)((long)&this_00[1].boxarray.m_bat.m_op + 0xc) + (long)iVar1 * 8);
  }
  return pFVar2;
}

Assistant:

const FArrayBox*
EBFArrayBox::getVolFracData () const
{
    if (m_factory && m_box_index >= 0) {
        MultiFab const& mf = m_factory->getVolFrac();
        return &(mf[m_box_index]);
    } else {
        return nullptr;
    }
}